

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O1

int __thiscall
llbuild::commands::executeNinjaCommand
          (commands *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  size_t sVar4;
  bool bVar5;
  char cVar6;
  long *plVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  StringRef str;
  StringRef filename;
  StringRef buffer;
  long *plStack_f0;
  byte bStack_e8;
  Token TStack_e0;
  string sStack_c8;
  Lexer LStack_a0;
  commands *pcStack_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  cVar6 = (char)args;
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48;
  plVar7 = *(long **)this;
  if (plVar7 == *(long **)(this + 8)) {
LAB_001202a0:
    executeNinjaCommand();
    sVar4 = plVar7[1] - *plVar7;
    pcStack_78 = this;
    if (sVar4 != 0x20) {
      executeLexCommand();
      return 1;
    }
    filename.Length = *(size_t *)*plVar7;
    filename.Data = (char *)&plStack_f0;
    util::readFileContents(filename);
    if ((bStack_e8 & 1) == 0) {
      if (cVar6 == '\0') {
        executeLexCommand();
      }
      if ((bStack_e8 & 1) == 0) {
        buffer.Length = plStack_f0[2] - plStack_f0[1];
        buffer.Data = (char *)plStack_f0[1];
        ninja::Lexer::Lexer(&LStack_a0,buffer);
        do {
          ninja::Lexer::lex(&LStack_a0,&TStack_e0);
          if (cVar6 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(Token \"",8);
            __s = ninja::Token::getKindName(&TStack_e0);
            if (__s == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x21b930);
            }
            else {
              sVar2 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," String:\"",9)
            ;
            str.Data = (char *)(ulong)TStack_e0.length;
            str.Length = sVar4;
            util::escapedString_abi_cxx11_(&sStack_c8,(util *)TStack_e0.start,str);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,sStack_c8._M_dataplus._M_p,
                                sStack_c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," Length:",8);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," Line:",6);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," Column:",8);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_c8._M_dataplus._M_p != &sStack_c8.field_2) {
              operator_delete(sStack_c8._M_dataplus._M_p,sStack_c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        } while (TStack_e0.tokenKind != EndOfFile);
        ninja::Lexer::~Lexer(&LStack_a0);
        if (plStack_f0 != (long *)0x0) {
          (**(code **)(*plStack_f0 + 8))();
        }
        return 0;
      }
    }
    else {
      executeLexCommand();
    }
    __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Error.h"
                  ,0x26c,
                  "storage_type *llvm::Expected<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                 );
  }
  cVar6 = '%';
  iVar1 = std::__cxx11::string::compare((char *)plVar7);
  if (iVar1 == 0) goto LAB_001202a0;
  iVar1 = std::__cxx11::string::compare(*(char **)this);
  if (iVar1 == 0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               *(long *)this + 0x20,*(undefined8 *)(this + 8));
    bVar5 = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare(*(char **)this);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare(*(char **)this);
      if (iVar1 == 0) {
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   *(long *)this + 0x20,*(undefined8 *)(this + 8));
        bVar5 = false;
      }
      else {
        iVar1 = std::__cxx11::string::compare(*(char **)this);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare(*(char **)this);
          if (iVar1 == 0) {
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_48,*(long *)this + 0x20,*(undefined8 *)(this + 8));
            bVar5 = false;
          }
          else {
            iVar1 = std::__cxx11::string::compare(*(char **)this);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare(*(char **)this);
              if (iVar1 != 0) {
                executeNinjaCommand(this);
                return 1;
              }
              local_28 = 0;
              uStack_20 = 0;
              local_18 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_28,*(long *)this + 0x20,*(undefined8 *)(this + 8));
              iVar1 = executeNinjaBuildCommand
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_28);
              this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        &local_28;
              goto LAB_0012027d;
            }
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_48,*(long *)this + 0x20,*(undefined8 *)(this + 8));
            bVar5 = true;
          }
          iVar1 = executeLoadManifestCommand(&local_48,bVar5);
          this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48;
          goto LAB_0012027d;
        }
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   *(long *)this + 0x20,*(undefined8 *)(this + 8));
        bVar5 = true;
      }
      iVar1 = executeParseCommand(&local_48,bVar5);
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48;
      goto LAB_0012027d;
    }
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               *(long *)this + 0x20,*(undefined8 *)(this + 8));
    bVar5 = true;
  }
  iVar1 = executeLexCommand(&local_48,bVar5);
LAB_0012027d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  return iVar1;
}

Assistant:

int commands::executeNinjaCommand(const std::vector<std::string>& args) {
  // Expect the first argument to be the name of another subtool to delegate to.
  if (args.empty() || args[0] == "--help")
    usage();

  if (args[0] == "lex") {
    return executeLexCommand(std::vector<std::string>(args.begin()+1,
                                                      args.end()),
                             /*LexOnly=*/false);
  } else if (args[0] == "lex-only") {
    return executeLexCommand(std::vector<std::string>(args.begin()+1,
                                                      args.end()),
                             /*LexOnly=*/true);
  } else if (args[0] == "parse") {
    return executeParseCommand(std::vector<std::string>(args.begin()+1,
                                                        args.end()),
                               /*ParseOnly=*/false);
  } else if (args[0] == "parse-only") {
    return executeParseCommand(std::vector<std::string>(args.begin()+1,
                                                        args.end()),
                               /*ParseOnly=*/true);
  } else if (args[0] == "load-manifest") {
    return executeLoadManifestCommand(std::vector<std::string>(args.begin()+1,
                                                               args.end()),
                                      /*LoadOnly=*/false);
  } else if (args[0] == "load-manifest-only") {
    return executeLoadManifestCommand(std::vector<std::string>(args.begin()+1,
                                                               args.end()),
                                      /*LoadOnly=*/true);
  } else if (args[0] == "build") {
    return executeNinjaBuildCommand(std::vector<std::string>(args.begin()+1,
                                                             args.end()));
  } else {
    fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
            args[0].c_str());
    return 1;
  }
}